

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftlzw.c
# Opt level: O0

FT_Error ft_lzw_check_header(FT_Stream stream)

{
  FT_Byte local_16;
  char local_15;
  FT_Error local_14;
  FT_Byte head [2];
  FT_Stream pFStack_10;
  FT_Error error;
  FT_Stream stream_local;
  
  pFStack_10 = stream;
  local_14 = FT_Stream_Seek(stream,0);
  if (((local_14 == 0) && (local_14 = FT_Stream_Read(pFStack_10,&local_16,2), local_14 == 0)) &&
     ((local_16 != '\x1f' || (local_15 != -99)))) {
    local_14 = 3;
  }
  return local_14;
}

Assistant:

static FT_Error
  ft_lzw_check_header( FT_Stream  stream )
  {
    FT_Error  error;
    FT_Byte   head[2];


    if ( FT_STREAM_SEEK( 0 )       ||
         FT_STREAM_READ( head, 2 ) )
      goto Exit;

    /* head[0] && head[1] are the magic numbers */
    if ( head[0] != 0x1F ||
         head[1] != 0x9D )
      error = FT_THROW( Invalid_File_Format );

  Exit:
    return error;
  }